

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O3

void SourceMap::Add(AutoString *path,AutoString *data)

{
  LPWSTR pWVar1;
  FileNode *pFVar2;
  
  pFVar2 = (FileNode *)operator_new(0x48);
  (pFVar2->data).length = data->length;
  pWVar1 = data->data_wide;
  (pFVar2->data).data = data->data;
  (pFVar2->data).data_wide = pWVar1;
  (pFVar2->data).errorCode = JsNoError;
  (pFVar2->data).dontFree = false;
  (pFVar2->path).length = path->length;
  pWVar1 = path->data_wide;
  (pFVar2->path).data = path->data;
  (pFVar2->path).data_wide = pWVar1;
  (pFVar2->path).errorCode = JsNoError;
  (pFVar2->path).dontFree = false;
  pFVar2->next = (FileNode *)0x0;
  path->dontFree = true;
  data->dontFree = true;
  if (root != (FileNode *)0x0) {
    pFVar2->next = root;
  }
  root = pFVar2;
  return;
}

Assistant:

static void Add(AutoString &path, AutoString &data)
    {
        // SourceMap lifetime == process lifetime
        FileNode * node = new FileNode(path, data);
        if (root != nullptr)
        {
            node->next = root;
        }
        root = node;
    }